

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O2

void Abc_FlowRetime_Dfs_back(Abc_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  Abc_Obj_t *p;
  int iVar1;
  long lVar2;
  
  if ((*(uint *)&pObj->field_0x14 & 0xf) == 8) {
    return;
  }
  Abc_NodeSetTravIdCurrent(pObj);
  for (lVar2 = 0; lVar2 < (pObj->vFanins).nSize; lVar2 = lVar2 + 1) {
    p = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar2]];
    iVar1 = Abc_NodeIsTravIdCurrent(p);
    if (iVar1 == 0) {
      Abc_FlowRetime_Dfs_back(p,vNodes);
    }
  }
  Vec_PtrPush(vNodes,pObj);
  return;
}

Assistant:

static inline int         Abc_ObjIsLatch( Abc_Obj_t * pObj )         { return pObj->Type == ABC_OBJ_LATCH;   }